

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTDMT_compressCCtx(ZSTDMT_CCtx *mtctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,
                          int compressionLevel)

{
  ZSTD_parameters params_00;
  int overlapLog;
  size_t sVar1;
  ZSTD_parameters params;
  ZSTD_parameters local_58;
  
  ZSTD_getParams(&local_58,compressionLevel,srcSize,0);
  overlapLog = ZSTDMT_overlapLog_default(local_58.cParams.strategy);
  local_58.fParams.contentSizeFlag = 1;
  params_00.fParams.contentSizeFlag = 1;
  params_00.cParams.strategy = local_58.cParams.strategy;
  params_00.cParams.hashLog = local_58.cParams.hashLog;
  params_00.cParams.searchLog = local_58.cParams.searchLog;
  params_00.cParams.windowLog = local_58.cParams.windowLog;
  params_00.cParams.chainLog = local_58.cParams.chainLog;
  params_00.cParams.minMatch = local_58.cParams.minMatch;
  params_00.cParams.targetLength = local_58.cParams.targetLength;
  params_00.fParams.checksumFlag = local_58.fParams.checksumFlag;
  params_00.fParams.noDictIDFlag = local_58.fParams.noDictIDFlag;
  sVar1 = ZSTDMT_compress_advanced
                    (mtctx,dst,dstCapacity,src,srcSize,(ZSTD_CDict *)0x0,params_00,overlapLog);
  return sVar1;
}

Assistant:

size_t ZSTDMT_compressCCtx(ZSTDMT_CCtx* mtctx,
                           void* dst, size_t dstCapacity,
                     const void* src, size_t srcSize,
                           int compressionLevel)
{
    ZSTD_parameters params = ZSTD_getParams(compressionLevel, srcSize, 0);
    int const overlapLog = ZSTDMT_overlapLog_default(params.cParams.strategy);
    params.fParams.contentSizeFlag = 1;
    return ZSTDMT_compress_advanced(mtctx, dst, dstCapacity, src, srcSize, NULL, params, overlapLog);
}